

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O1

int rhash_final(rhash ctx,uchar *first_result)

{
  byte *pbVar1;
  code *pcVar2;
  uint uVar3;
  rhash prVar4;
  uchar buffer [130];
  uchar auStack_a8 [136];
  
  if (10 < (uint)ctx[1].msg_size) {
    __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0x109,"int rhash_final(rhash, unsigned char *)");
  }
  if (first_result == (uchar *)0x0) {
    first_result = auStack_a8;
  }
  if ((~*(uint *)((long)&ctx[1].msg_size + 4) & 3) != 0) {
    if ((int)ctx[1].msg_size != 0) {
      prVar4 = ctx + 4;
      uVar3 = 0;
      do {
        pcVar2 = (code *)(*(long **)&prVar4[-1].hash_id)[5];
        if (pcVar2 == (code *)0x0) {
          __assert_fail("info->final != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                        ,0x112,"int rhash_final(rhash, unsigned char *)");
        }
        if (0x81 < *(ulong *)(**(long **)&prVar4[-1].hash_id + 8)) {
          __assert_fail("info->info->digest_size < sizeof(buffer)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                        ,0x113,"int rhash_final(rhash, unsigned char *)");
        }
        (*pcVar2)(prVar4->msg_size,first_result);
        uVar3 = uVar3 + 1;
        prVar4 = prVar4 + 1;
        first_result = auStack_a8;
      } while (uVar3 < (uint)ctx[1].msg_size);
    }
    pbVar1 = (byte *)((long)&ctx[1].msg_size + 4);
    *pbVar1 = *pbVar1 | 2;
  }
  return 0;
}

Assistant:

RHASH_API int rhash_final(rhash ctx, unsigned char* first_result)
{
	unsigned i = 0;
	unsigned char buffer[130];
	unsigned char* out = (first_result ? first_result : buffer);
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);

	/* skip final call if already finalized and auto-final is on */
	if ((ectx->flags & RCTX_FINALIZED_MASK) ==
		(RCTX_AUTO_FINAL | RCTX_FINALIZED)) return 0;

	/* call final method for every algorithm */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		assert(info->final != 0);
		assert(info->info->digest_size < sizeof(buffer));
		info->final(ectx->vector[i].context, out);
		out = buffer;
	}
	ectx->flags |= RCTX_FINALIZED;
	return 0; /* no error processing at the moment */
}